

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool nlohmann::operator<(const_reference lhs,const_reference rhs)

{
  number_integer_t nVar1;
  value_t lhs_00;
  value_t rhs_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  value_t rhs_type;
  value_t lhs_type;
  const_reference rhs_local;
  const_reference lhs_local;
  
  lhs_00 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::type(lhs);
  rhs_00 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::type(rhs);
  if (lhs_00 == rhs_00) {
    switch(lhs_00) {
    case null:
      lhs_local._7_1_ = false;
      break;
    case object:
      lhs_local._7_1_ = std::operator<((lhs->m_value).object,(rhs->m_value).object);
      break;
    case array:
      lhs_local._7_1_ =
           std::operator<((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           *)(lhs->m_value).object,
                          (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                           *)(rhs->m_value).object);
      break;
    case string:
      lhs_local._7_1_ =
           std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (lhs->m_value).object,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (rhs->m_value).object);
      break;
    case boolean:
      lhs_local._7_1_ = ((lhs->m_value).boolean & 1U) < ((rhs->m_value).boolean & 1U);
      break;
    case number_integer:
      lhs_local._7_1_ = (lhs->m_value).number_integer < (rhs->m_value).number_integer;
      break;
    case number_unsigned:
      lhs_local._7_1_ = (lhs->m_value).object < (rhs->m_value).object;
      break;
    case number_float:
      lhs_local._7_1_ = (lhs->m_value).number_float < (rhs->m_value).number_float;
      break;
    default:
      lhs_local._7_1_ = false;
    }
  }
  else if ((lhs_00 == number_integer) && (rhs_00 == number_float)) {
    lhs_local._7_1_ = (double)(lhs->m_value).number_integer < (rhs->m_value).number_float;
  }
  else if ((lhs_00 == number_float) && (rhs_00 == number_integer)) {
    lhs_local._7_1_ = (lhs->m_value).number_float < (double)(rhs->m_value).number_integer;
  }
  else if ((lhs_00 == number_unsigned) && (rhs_00 == number_float)) {
    nVar1 = (lhs->m_value).number_integer;
    auVar3._8_4_ = (int)((ulong)nVar1 >> 0x20);
    auVar3._0_8_ = nVar1;
    auVar3._12_4_ = 0x45300000;
    lhs_local._7_1_ =
         (auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) <
         (rhs->m_value).number_float;
  }
  else if ((lhs_00 == number_float) && (rhs_00 == number_unsigned)) {
    nVar1 = (rhs->m_value).number_integer;
    auVar2._8_4_ = (int)((ulong)nVar1 >> 0x20);
    auVar2._0_8_ = nVar1;
    auVar2._12_4_ = 0x45300000;
    lhs_local._7_1_ =
         (lhs->m_value).number_float <
         (auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0);
  }
  else if ((lhs_00 == number_integer) && (rhs_00 == number_unsigned)) {
    lhs_local._7_1_ = (lhs->m_value).number_integer < (rhs->m_value).number_integer;
  }
  else if ((lhs_00 == number_unsigned) && (rhs_00 == number_integer)) {
    lhs_local._7_1_ = (lhs->m_value).number_integer < (rhs->m_value).number_integer;
  }
  else {
    lhs_local._7_1_ = detail::operator<(lhs_00,rhs_00);
  }
  return lhs_local._7_1_;
}

Assistant:

friend bool operator<(const_reference lhs, const_reference rhs) noexcept {
		const auto lhs_type = lhs.type();
		const auto rhs_type = rhs.type();

		if (lhs_type == rhs_type) {
			switch (lhs_type) {
				case value_t::array:
					return (*lhs.m_value.array) < (*rhs.m_value.array);

				case value_t::object:
					return *lhs.m_value.object < *rhs.m_value.object;

				case value_t::null:
					return false;

				case value_t::string:
					return *lhs.m_value.string < *rhs.m_value.string;

				case value_t::boolean:
					return lhs.m_value.boolean < rhs.m_value.boolean;

				case value_t::number_integer:
					return lhs.m_value.number_integer < rhs.m_value.number_integer;

				case value_t::number_unsigned:
					return lhs.m_value.number_unsigned < rhs.m_value.number_unsigned;

				case value_t::number_float:
					return lhs.m_value.number_float < rhs.m_value.number_float;

				default:
					return false;
			}
		} else if (lhs_type == value_t::number_integer and rhs_type == value_t::number_float) {
			return static_cast<number_float_t>(lhs.m_value.number_integer) < rhs.m_value.number_float;
		} else if (lhs_type == value_t::number_float and rhs_type == value_t::number_integer) {
			return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_integer);
		} else if (lhs_type == value_t::number_unsigned and rhs_type == value_t::number_float) {
			return static_cast<number_float_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_float;
		} else if (lhs_type == value_t::number_float and rhs_type == value_t::number_unsigned) {
			return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_unsigned);
		} else if (lhs_type == value_t::number_integer and rhs_type == value_t::number_unsigned) {
			return lhs.m_value.number_integer < static_cast<number_integer_t>(rhs.m_value.number_unsigned);
		} else if (lhs_type == value_t::number_unsigned and rhs_type == value_t::number_integer) {
			return static_cast<number_integer_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_integer;
		}

		// We only reach this line if we cannot compare values. In that case,
		// we compare types. Note we have to call the operator explicitly,
		// because MSVC has problems otherwise.
		return operator<(lhs_type, rhs_type);
	}